

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGeneratorFunction.cpp
# Opt level: O1

DescriptorFlags __thiscall
Js::JavascriptGeneratorFunction::GetSetter
          (JavascriptGeneratorFunction *this,JavascriptString *propertyNameString,Var *setterValue,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  DescriptorFlags DVar1;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord;
  
  propertyRecord = (PropertyRecord *)requestContext;
  ScriptContext::FindPropertyRecord
            ((((((this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
                 super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr,propertyNameString,&local_40);
  if ((local_40 == (PropertyRecord *)0x0) || ((local_40->pid | 2U) != 0x1cf)) {
    DVar1 = JavascriptFunction::GetSetter
                      ((JavascriptFunction *)this,propertyNameString,setterValue,info,
                       (ScriptContext *)propertyRecord);
  }
  else {
    DVar1 = DynamicObject::GetSetter
                      ((DynamicObject *)this,propertyNameString,setterValue,info,
                       (ScriptContext *)propertyRecord);
  }
  return DVar1;
}

Assistant:

DescriptorFlags JavascriptGeneratorFunction::GetSetter(JavascriptString* propertyNameString, Var *setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        PropertyRecord const* propertyRecord;
        this->GetScriptContext()->FindPropertyRecord(propertyNameString, &propertyRecord);

        if (propertyRecord != nullptr)
        {
            if ((propertyRecord->GetPropertyId() == PropertyIds::caller || propertyRecord->GetPropertyId() == PropertyIds::arguments))
            {
                // JavascriptFunction has special case for caller and arguments; call DynamicObject:: virtual directly to skip that.
                return DynamicObject::GetSetter(propertyNameString, setterValue, info, requestContext);
            }
        }

        return JavascriptFunction::GetSetter(propertyNameString, setterValue, info, requestContext);
    }